

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<pstore::uint128>
          (database_writer_policy *this,uint128 *value)

{
  undefined8 uVar1;
  typed_address<pstore::uint128> tVar2;
  shared_ptr<pstore::uint128> ptr;
  typed_address<pstore::uint128> addr;
  pair<std::shared_ptr<pstore::uint128>,_pstore::typed_address<pstore::uint128>_> local_40;
  typed_address<pstore::uint128> *local_28;
  undefined1 *local_20;
  
  ptr.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ptr.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addr.a_.a_ = (address)0;
  transaction_base::alloc_rw<pstore::uint128,void>(&local_40,this->transaction_,1);
  local_28 = &addr;
  local_20 = (undefined1 *)&ptr;
  std::tuple<std::shared_ptr<pstore::uint128>&,pstore::typed_address<pstore::uint128>&>::operator=
            ((tuple<std::shared_ptr<pstore::uint128>&,pstore::typed_address<pstore::uint128>&> *)
             &local_28,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.first.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tVar2 = addr;
  uVar1 = *(undefined8 *)((long)&value->v_ + 8);
  *(long *)&(ptr.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->v_ =
       (long)value->v_;
  *(undefined8 *)
   ((long)&(ptr.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->v_ + 8) =
       uVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<pstore::uint128,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (result_type)(value_type)tVar2.a_.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }